

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_for::dump(statement_for *this,ostream *o)

{
  iterator *this_00;
  _Elt_pointer ppsVar1;
  reference ptVar2;
  _Map_pointer pppsVar3;
  _Elt_pointer ppsVar4;
  statement_base **ptr;
  _Elt_pointer ppsVar5;
  
  std::operator<<(o,"< BeginFor >\n");
  std::operator<<(o,"< Iterator = ");
  this_00 = &(this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  ptVar2 = std::
           _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
           ::operator[](this_00,0);
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::operator<<(o," >\n< Condition = ");
  ptVar2 = std::
           _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
           ::operator[](this_00,1);
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::operator<<(o," >\n< Increment = ");
  ptVar2 = std::
           _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
           ::operator[](this_00,2);
  compiler_type::dump_expr(ptVar2->mRoot,o);
  std::operator<<(o," >\n< Body >\n");
  ppsVar5 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar3 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,o);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar4) {
      ppsVar5 = pppsVar3[1];
      pppsVar3 = pppsVar3 + 1;
      ppsVar4 = ppsVar5 + 0x40;
    }
  }
  std::operator<<(o,"< EndFor >\n");
  return;
}

Assistant:

void statement_for::dump(std::ostream &o) const
	{
		o << "< BeginFor >\n";
		o << "< Iterator = ";
		compiler_type::dump_expr(mParallel[0].root(), o);
		o << " >\n< Condition = ";
		compiler_type::dump_expr(mParallel[1].root(), o);
		o << " >\n< Increment = ";
		compiler_type::dump_expr(mParallel[2].root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFor >\n";
	}